

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c.c
# Opt level: O2

Boolean f2c_alloc_get_(Integer *datatype,Integer *nelem,char *name,Integer *memhandle,
                      MA_AccessIndex *index,int namesize)

{
  Boolean BVar1;
  char buf [32];
  
  ga_f2cstring(name,namesize,buf,0x20);
  BVar1 = MA_alloc_get(*datatype,*nelem,buf,memhandle,index);
  *index = *index + 1;
  return BVar1;
}

Assistant:

FATR f2c_alloc_get_(datatype, nelem, name, memhandle, index, namesize)
    Integer *datatype;
    Integer *nelem;
    char    *name;
    Integer *memhandle;
    MA_AccessIndex *index;
    int  namesize;   /* implicitly passed by FORTRAN */
#else /* F2C_HIDDEN_STRING_LENGTH_AFTER_ARGS */
public Boolean FATR f2c_alloc_get_(datatype, nelem, name, namesize, memhandle, index)
    Integer *datatype;
    Integer *nelem;
    char    *name;
    int  namesize;   /* implicitly passed by FORTRAN */
    Integer *memhandle;
    MA_AccessIndex *index;
#endif /* F2C_HIDDEN_STRING_LENGTH_AFTER_ARGS */
{
    Boolean value;
    char buf[MA_NAMESIZE];

    /* ensure that name is NUL-terminated */
    ga_f2cstring(name, namesize, buf, (Integer)sizeof(buf));

    value = MA_alloc_get(*datatype, *nelem, buf, memhandle, index);

    /* FORTRAN array indexing is 1-based, so increment index */
    (*index)++;

    return value;
}